

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O0

void __thiscall
DecHeap::DecHeap(DecHeap *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *heap)

{
  unsigned_long uVar1;
  size_type sVar2;
  const_reference __args;
  iterator iVar3;
  iterator iVar4;
  reference pvVar5;
  reference pvVar6;
  ulong local_50;
  size_t i_1;
  unsigned_long local_20;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *heap_local;
  DecHeap *this_local;
  
  i = (size_t)heap;
  heap_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this;
  memset(this,0,0x18);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&this->heap);
  memset(&this->idx_map,0,0x18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->idx_map);
  local_20 = 0;
  while( true ) {
    uVar1 = local_20;
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)i);
    if (sVar2 <= uVar1) break;
    __args = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)i,local_20);
    std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<unsigned_long_const&,unsigned_long&>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)this,__args,&local_20);
    local_20 = local_20 + 1;
  }
  iVar3 = std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::begin(&this->heap);
  iVar4 = std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::end(&this->heap);
  std::
  make_heap<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>,std::greater<std::pair<unsigned_long,unsigned_long>>>
            (iVar3._M_current,iVar4._M_current);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)i);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->idx_map,sVar2);
  local_50 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::size(&this->heap);
    if (sVar2 <= local_50) break;
    pvVar5 = std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::operator[](&this->heap,local_50);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->idx_map,pvVar5->second);
    *pvVar6 = local_50;
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

DecHeap::DecHeap(const std::vector<size_t> &heap) {
    for (size_t i = 0; i < heap.size(); ++i) {
        this->heap.emplace_back(heap[i], i);
    }
    std::make_heap(this->heap.begin(), this->heap.end(), std::greater<std::pair<size_t, size_t>>());
    this->idx_map.resize(heap.size());
    for (size_t i = 0; i < this->heap.size(); ++i) {
        this->idx_map[this->heap[i].second] = i;
    }
}